

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void llvm::cl::PrintHelpMessage(bool Hidden,bool Categorized)

{
  CategorizedHelpPrinter *this;
  
  if (Hidden || Categorized) {
    if (Categorized && !Hidden) {
      this = &CategorizedNormalPrinter;
    }
    else {
      this = (CategorizedHelpPrinter *)&UncategorizedHiddenPrinter;
      if (Categorized) {
        this = &CategorizedHiddenPrinter;
      }
      if (!Hidden) {
        this = &CategorizedHiddenPrinter;
      }
    }
  }
  else {
    this = (CategorizedHelpPrinter *)&UncategorizedNormalPrinter;
  }
  anon_unknown.dwarf_1a85c0::HelpPrinter::printHelp(&this->super_HelpPrinter);
  return;
}

Assistant:

void cl::PrintHelpMessage(bool Hidden, bool Categorized) {
  if (!Hidden && !Categorized)
    UncategorizedNormalPrinter.printHelp();
  else if (!Hidden && Categorized)
    CategorizedNormalPrinter.printHelp();
  else if (Hidden && !Categorized)
    UncategorizedHiddenPrinter.printHelp();
  else
    CategorizedHiddenPrinter.printHelp();
}